

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_precomputed_adjacency_list.h
# Opt level: O3

void __thiscall
AdjacencyListSBPLEnv<Point2D>::addPoint(AdjacencyListSBPLEnv<Point2D> *this,Point2D *c)

{
  pointer *ppPVar1;
  pointer *pppiVar2;
  pointer pPVar3;
  pointer pPVar4;
  iterator __position;
  iterator __position_00;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  mapped_type *pmVar7;
  int *entry;
  Adjacencies a;
  int *local_38;
  _List_node_base local_30;
  undefined8 local_20;
  
  pPVar3 = (this->points_).super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar4 = (this->points_).super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar7 = std::
           map<Point2D,_int,_std::less<Point2D>,_std::allocator<std::pair<const_Point2D,_int>_>_>::
           operator[](&this->pointIds_,c);
  *pmVar7 = (mapped_type)((ulong)((long)pPVar3 - (long)pPVar4) >> 3);
  local_30._M_next = &local_30;
  local_20 = 0;
  __position._M_current =
       (this->points_).super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30._M_prev = local_30._M_next;
  if (__position._M_current ==
      (this->points_).super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Point2D,std::allocator<Point2D>>::_M_realloc_insert<Point2D_const&>
              ((vector<Point2D,std::allocator<Point2D>> *)&this->points_,__position,c);
  }
  else {
    *__position._M_current = *c;
    ppPVar1 = &(this->points_).super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  std::
  vector<std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>,_std::allocator<std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>_>_>
  ::push_back(&this->adjacency_vector_,(value_type *)&local_30);
  local_38 = (int *)operator_new__(8);
  local_38[0] = -1;
  local_38[1] = -1;
  __position_00._M_current =
       (this->super_DiscreteSpaceInformation).StateID2IndexMapping.
       super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->super_DiscreteSpaceInformation).StateID2IndexMapping.
      super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
              ((vector<int*,std::allocator<int*>> *)
               &(this->super_DiscreteSpaceInformation).StateID2IndexMapping,__position_00,&local_38)
    ;
    p_Var6 = local_30._M_next;
  }
  else {
    *__position_00._M_current = local_38;
    pppiVar2 = &(this->super_DiscreteSpaceInformation).StateID2IndexMapping.
                super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
                _M_finish;
    *pppiVar2 = *pppiVar2 + 1;
    p_Var6 = local_30._M_next;
  }
  while (p_Var6 != &local_30) {
    p_Var5 = (((_List_base<Adjacency,_std::allocator<Adjacency>_> *)&p_Var6->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var6,0x18);
    p_Var6 = p_Var5;
  }
  return;
}

Assistant:

void AdjacencyListSBPLEnv<Coords>::addPoint(const Coords& c)
{
    pointIds_[c] = points_.size();
    Adjacencies a;
    points_.push_back(c);
    adjacency_vector_.push_back(a);

    int* entry = new int[NUMOFINDICES_STATEID2IND];
    for (unsigned int i = 0; i < NUMOFINDICES_STATEID2IND; i++) {
        entry[i] = -1;
    }
    StateID2IndexMapping.push_back(entry);
}